

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_prn.cc
# Opt level: O0

int X509V3_EXT_print(BIO *out,X509_EXTENSION *ext,ulong flag,int indent)

{
  long lVar1;
  int iVar2;
  ASN1_VALUE *val;
  int local_64;
  stack_st_CONF_VALUE *psStack_60;
  int ok;
  stack_st_CONF_VALUE *nval;
  char *value;
  void *ext_str;
  uchar *p;
  ASN1_STRING *ext_data;
  X509V3_EXT_METHOD *method;
  ulong uStack_28;
  int indent_local;
  unsigned_long flag_local;
  X509_EXTENSION *ext_local;
  BIO *out_local;
  
  method._4_4_ = indent;
  uStack_28 = flag;
  flag_local = (unsigned_long)ext;
  ext_local = (X509_EXTENSION *)out;
  ext_data = (ASN1_STRING *)X509V3_EXT_get(ext);
  if ((X509V3_EXT_METHOD *)ext_data == (X509V3_EXT_METHOD *)0x0) {
    iVar2 = unknown_ext_print((BIO *)ext_local,(X509_EXTENSION *)flag_local,uStack_28,method._4_4_,0
                             );
    return iVar2;
  }
  p = (uchar *)X509_EXTENSION_get_data((X509_EXTENSION *)flag_local);
  ext_str = ASN1_STRING_get0_data((ASN1_STRING *)p);
  iVar2 = ASN1_STRING_length((ASN1_STRING *)p);
  val = ASN1_item_d2i((ASN1_VALUE **)0x0,(uchar **)&ext_str,(long)iVar2,(ASN1_ITEM *)ext_data->data)
  ;
  if (val == (ASN1_VALUE *)0x0) {
    iVar2 = unknown_ext_print((BIO *)ext_local,(X509_EXTENSION *)flag_local,uStack_28,method._4_4_,1
                             );
    return iVar2;
  }
  nval = (stack_st_CONF_VALUE *)0x0;
  psStack_60 = (stack_st_CONF_VALUE *)0x0;
  local_64 = 0;
  lVar1._0_4_ = ext_data[2].length;
  lVar1._4_4_ = ext_data[2].type;
  if (lVar1 == 0) {
    if (ext_data[2].flags == 0) {
      if (ext_data[3].data == (uchar *)0x0) {
        ERR_put_error(0x14,0,0x93,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_prn.cc"
                      ,0x60);
        goto LAB_004c20db;
      }
      iVar2 = (*(code *)ext_data[3].data)(ext_data,val,ext_local,method._4_4_);
      if (iVar2 == 0) goto LAB_004c20db;
    }
    else {
      psStack_60 = (stack_st_CONF_VALUE *)(*(code *)ext_data[2].flags)(ext_data,val,0);
      if (psStack_60 == (stack_st_CONF_VALUE *)0x0) goto LAB_004c20db;
      X509V3_EXT_val_prn((BIO *)ext_local,(stack_st_CONF_VALUE *)psStack_60,method._4_4_,
                         ext_data->type & 4);
    }
  }
  else {
    nval = (stack_st_CONF_VALUE *)(**(code **)(ext_data + 2))(ext_data,val);
    if (nval == (stack_st_CONF_VALUE *)0x0) goto LAB_004c20db;
    BIO_printf((BIO *)ext_local,"%*s%s",(ulong)method._4_4_,"",nval);
  }
  local_64 = 1;
LAB_004c20db:
  sk_CONF_VALUE_pop_free(psStack_60,X509V3_conf_free);
  OPENSSL_free(nval);
  ASN1_item_free(val,(ASN1_ITEM *)ext_data->data);
  return local_64;
}

Assistant:

int X509V3_EXT_print(BIO *out, const X509_EXTENSION *ext, unsigned long flag,
                     int indent) {
  const X509V3_EXT_METHOD *method = X509V3_EXT_get(ext);
  if (method == NULL) {
    return unknown_ext_print(out, ext, flag, indent, 0);
  }
  const ASN1_STRING *ext_data = X509_EXTENSION_get_data(ext);
  const unsigned char *p = ASN1_STRING_get0_data(ext_data);
  void *ext_str = ASN1_item_d2i(NULL, &p, ASN1_STRING_length(ext_data),
                                ASN1_ITEM_ptr(method->it));
  if (!ext_str) {
    return unknown_ext_print(out, ext, flag, indent, 1);
  }

  char *value = NULL;
  STACK_OF(CONF_VALUE) *nval = NULL;
  int ok = 0;
  if (method->i2s) {
    if (!(value = method->i2s(method, ext_str))) {
      goto err;
    }
    BIO_printf(out, "%*s%s", indent, "", value);
  } else if (method->i2v) {
    if (!(nval = method->i2v(method, ext_str, NULL))) {
      goto err;
    }
    X509V3_EXT_val_prn(out, nval, indent,
                       method->ext_flags & X509V3_EXT_MULTILINE);
  } else if (method->i2r) {
    if (!method->i2r(method, ext_str, out, indent)) {
      goto err;
    }
  } else {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_OPERATION_NOT_DEFINED);
    goto err;
  }

  ok = 1;

err:
  sk_CONF_VALUE_pop_free(nval, X509V3_conf_free);
  OPENSSL_free(value);
  ASN1_item_free(reinterpret_cast<ASN1_VALUE *>(ext_str),
                 ASN1_ITEM_ptr(method->it));
  return ok;
}